

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::file_renamed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,file_renamed_alert *this)

{
  char msg [200];
  char acStack_e8 [208];
  
  torrent_alert::message_abi_cxx11_(__return_storage_ptr__,&this->super_torrent_alert);
  snprintf(acStack_e8,200,": file %d renamed to ",(ulong)(uint)(this->index).m_val);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  aux::stack_allocator::ptr
            ((this->super_torrent_alert).m_alloc._M_data,(allocation_slot)(this->m_name_idx).m_idx);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string file_renamed_alert::message() const
	{
		std::string ret { torrent_alert::message() };
		char msg[200];
		std::snprintf(msg, sizeof(msg), ": file %d renamed to "
			, static_cast<int>(index));
		ret.append(msg);
		ret.append(new_name());
		return ret;
	}